

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O3

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          LogicalType params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer pcVar2;
  LogicalType params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7_00;
  undefined1 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef8;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff18;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff28;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_58 [16];
  LogicalType local_48;
  
  _Var5._M_p = &stack0xffffffffffffff30;
  pcVar2 = (fmt_str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff20,pcVar2,pcVar2 + fmt_str->_M_string_length);
  _Var4._M_p = &stack0xffffffffffffff10;
  pcVar2 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff00,pcVar2,pcVar2 + params->_M_string_length);
  LogicalType::LogicalType((LogicalType *)&local_80,(LogicalType *)params_1);
  puVar3 = &stack0xfffffffffffffef0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee0,*(long *)params_2,
             (long)&((params_2->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)params_2);
  LogicalType::LogicalType(&local_48,(LogicalType *)params_3);
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,*(long *)params_4._0_8_,
             *(long *)(params_4._0_8_ + 8) + *(long *)params_4._0_8_);
  local_c0[0] = local_b0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,
             (params_4.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ExtraTypeInfo,
             *(long *)&(params_4.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->type +
             (long)(params_4.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ExtraTypeInfo);
  _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&local_80.field_2 + 8);
  local_80.field_2._8_8_ = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)_Var1._M_pi,
             (params_4.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_vptr__Sp_counted_base,
             *(long *)&(params_4.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count +
             (long)(params_4.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base);
  params_4_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c0;
  params_4_00._0_8_ = (string *)local_a0;
  params_4_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  params_5_00._M_string_length = (size_type)puVar3;
  params_5_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  params_5_00.field_2 = in_stack_fffffffffffffee8;
  params_6_00._M_string_length = (size_type)_Var4._M_p;
  params_6_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffef8;
  params_6_00.field_2 = in_stack_ffffffffffffff08;
  params_7_00._M_string_length = (size_type)_Var5._M_p;
  params_7_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff18;
  params_7_00.field_2 = in_stack_ffffffffffffff28;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,(string *)&stack0xffffffffffffff20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff00,&local_80,(LogicalType *)&stack0xfffffffffffffee0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
             params_4_00,params_5_00,params_6_00,params_7_00);
  if ((undefined1 *)local_80.field_2._8_8_ != local_58) {
    operator_delete((void *)local_80.field_2._8_8_);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0]);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  LogicalType::~LogicalType(&local_48);
  if (puVar3 != &stack0xfffffffffffffef0) {
    operator_delete(puVar3);
  }
  LogicalType::~LogicalType((LogicalType *)&local_80);
  if (_Var4._M_p != &stack0xffffffffffffff10) {
    operator_delete(_Var4._M_p);
  }
  if (_Var5._M_p != &stack0xffffffffffffff30) {
    operator_delete(_Var5._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}